

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void __thiscall NetworkNS::Network::Network(Network *this,NetwMin *netw_min,string *filename)

{
  list<sNode,_std::allocator<sNode>_> *this_00;
  list<sStrand_*,_std::allocator<sStrand_*>_> *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  long lVar6;
  _List_node_base *p_Var7;
  pointer plVar8;
  _List_node_base *p_Var9;
  pointer pbVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  tNode *temp;
  long lVar17;
  ostream *poVar18;
  _List_iterator<sStrand_*> __position;
  double dVar19;
  double dVar20;
  _List_node_base *p_Var21;
  int iVar22;
  ulong uVar23;
  const_iterator __position_00;
  bool bVar24;
  double dyr;
  uint local_474;
  double local_470;
  _List_node_base *local_468;
  undefined8 local_460;
  int local_454;
  int local_450;
  int local_44c;
  vector<sBead_type,_std::allocator<sBead_type>_> *local_448;
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  *local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  long local_3e8;
  double dzr;
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  chains;
  _Vector_base<sNode_*,_std::allocator<sNode_*>_> local_3a8;
  pointer ppsStack_390;
  pointer local_388;
  pointer piStack_380;
  pointer local_378;
  pointer ppsStack_370;
  pointer local_368;
  pointer ppsStack_360;
  int local_358;
  undefined1 local_350 [16];
  double local_340;
  double local_338;
  NetwMin *local_330;
  Network *local_328;
  ulong local_320;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  ifstream data_file;
  int aiStack_218 [122];
  
  this->_vptr_Network = (_func_int **)&PTR__Network_0010fd68;
  this_00 = &this->nodes;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node._M_size = 0;
  local_468 = (_List_node_base *)&this->strands;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_prev = local_468;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_next = local_468;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node._M_size = 0;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->subchains;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->subchains;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this_01 = &this->pslip_springs;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  local_448 = &this->node_types;
  local_440 = &this->sorted_chains;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_330 = netw_min;
  local_328 = this;
  std::operator<<((ostream *)&std::cout,"#: Initializing network.\n");
  std::ifstream::ifstream(&data_file,(filename->_M_dataplus)._M_p,_S_in);
  lines_of_file.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines_of_file.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines_of_file.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar22 = 0;
  local_450 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  local_454 = 0;
  local_44c = 0;
  local_460 = (ulong)local_460._4_4_ << 0x20;
  uVar11 = 0;
  local_474 = 0;
  while (*(int *)((long)aiStack_218 + *(long *)(_data_file + -0x18)) == 0) {
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&chains.
                   super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)chains.
                          super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&data_file,(string *)&chains);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lines_of_file,(value_type *)&chains);
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba05);
    if (lVar17 != -1) {
      local_474 = atoi((char *)chains.
                               super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba0b);
    if (lVar17 != -1) {
      uVar11 = atoi((char *)chains.
                            super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba11);
    iVar12 = (int)local_460;
    if (lVar17 != -1) {
      iVar12 = iVar22;
    }
    local_460 = CONCAT44(local_460._4_4_,iVar12);
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba17);
    if (lVar17 != -1) {
      local_44c = iVar22;
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba1d);
    if (lVar17 != -1) {
      iVar16 = iVar22;
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba24);
    if ((lVar17 != -1) &&
       (lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba29), lVar17 != -1)) {
      local_454 = iVar22;
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba30);
    if ((lVar17 != -1) &&
       (lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba29), lVar17 != -1)) {
      iVar15 = iVar22;
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba35);
    if ((lVar17 != -1) &&
       (lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba3a), lVar17 != -1)) {
      iVar14 = iVar22;
    }
    lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba40);
    if ((lVar17 != -1) &&
       (lVar17 = std::__cxx11::string::find((char *)&chains,0x10ba3a), lVar17 != -1)) {
      local_450 = iVar22;
    }
    iVar22 = iVar22 + 1;
    std::__cxx11::string::~string((string *)&chains);
  }
  std::ifstream::close();
  std::__cxx11::string::string
            ((string *)&local_2f8,
             (string *)
             (lines_of_file.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + iVar14));
  tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&chains,&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&tokens,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&chains);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&chains);
  std::__cxx11::string::~string((string *)&local_2f8);
  uVar13 = atoi(((tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  poVar18 = std::operator<<((ostream *)&std::cout,"#: --- Number of bead types: ");
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar13);
  std::operator<<(poVar18," .\n");
  std::vector<sBead_type,_std::allocator<sBead_type>_>::resize(local_448,(long)(int)uVar13);
  uVar23 = 0;
  local_320 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    local_320 = uVar23;
  }
  local_3e8 = (long)iVar15 * 0x20 + 0x40;
  lVar17 = (long)iVar16 * 0x20 + 0x40;
  local_320 = local_320 * 0x18;
  while (local_320 != uVar23) {
    std::__cxx11::string::string
              ((string *)&local_2b8,
               (string *)
               ((long)&((lines_of_file.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17));
    local_470 = (double)uVar23;
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&chains,&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&tokens,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&chains);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&chains);
    std::__cxx11::string::~string((string *)&local_2b8);
    pbVar10 = tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar20 = atof(tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    dVar19 = local_470;
    psVar3 = (local_448->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(double *)((long)&psVar3->n_mass + (long)local_470) = dVar20;
    dVar20 = atof(pbVar10[2]._M_dataplus._M_p);
    *(double *)((long)&psVar3->mass + (long)dVar19) = dVar20;
    std::__cxx11::string::string
              ((string *)&local_258,
               (string *)
               ((long)&((lines_of_file.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + local_3e8))
    ;
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&chains,&local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&tokens,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&chains);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&chains);
    std::__cxx11::string::~string((string *)&local_258);
    dVar20 = atof(tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    *(double *)
     ((long)&((local_448->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
              super__Vector_impl_data._M_start)->r_node + (long)local_470) = dVar20;
    local_3e8 = local_3e8 + 0x20;
    lVar17 = lVar17 + 0x20;
    uVar23 = (long)local_470 + 0x18;
  }
  std::__cxx11::string::string
            ((string *)&local_318,
             (string *)
             (lines_of_file.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_450));
  tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&chains,&local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&tokens,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&chains);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&chains);
  std::__cxx11::string::~string((string *)&local_318);
  uVar13 = atoi(((tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  poVar18 = std::operator<<((ostream *)&std::cout,"#: --- Number of bond types: ");
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar13);
  std::operator<<(poVar18," .\n");
  std::vector<sBond_type,_std::allocator<sBond_type>_>::resize(&this->bond_types,(long)(int)uVar13);
  dVar20 = 0.0;
  local_470 = (double)(ulong)uVar13;
  if ((int)uVar13 < 1) {
    local_470 = dVar20;
  }
  lVar17 = (long)local_454 * 0x20 + 0x40;
  local_470 = (double)((long)local_470 * 0x18);
  for (; local_470 != dVar20; dVar20 = (double)((long)dVar20 + 0x18)) {
    std::__cxx11::string::string
              ((string *)&local_278,
               (string *)
               ((long)&((lines_of_file.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17));
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&chains,&local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&tokens,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&chains);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&chains);
    std::__cxx11::string::~string((string *)&local_278);
    pbVar10 = tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar19 = atof(tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    psVar4 = (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(double *)((long)&psVar4->spring_coeff + (long)dVar20) = dVar19;
    dVar19 = atof(pbVar10[2]._M_dataplus._M_p);
    *(double *)((long)&psVar4->sq_ete + (long)dVar20) = dVar19;
    dVar19 = atof(pbVar10[3]._M_dataplus._M_p);
    *(double *)((long)&psVar4->kuhnl + (long)dVar20) = dVar19;
    lVar17 = lVar17 + 0x20;
  }
  uVar23 = 0;
  if (0 < (int)local_474) {
    uVar23 = (ulong)local_474;
  }
  lVar17 = (long)(int)local_460 * 0x20 + 0x40;
  while (bVar24 = uVar23 != 0, uVar23 = uVar23 - 1, bVar24) {
    std::__cxx11::string::string
              ((string *)&local_298,
               (string *)
               ((long)&((lines_of_file.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17));
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&chains,&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&tokens,(sNode *)&chains);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&chains);
    std::__cxx11::string::~string((string *)&local_298);
    pbVar10 = tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_368 = (pointer)0x0;
    ppsStack_360 = (pointer)0x0;
    local_378 = (pointer)0x0;
    ppsStack_370 = (pointer)0x0;
    local_388 = (pointer)0x0;
    piStack_380 = (pointer)0x0;
    local_3a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppsStack_390 = (pointer)0x0;
    local_3a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar14 = atoi(((tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(chains.
                           super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar14);
    iVar14 = atoi(pbVar10[2]._M_dataplus._M_p);
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(iVar14,chains.
                                  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)atof(pbVar10[4]._M_dataplus._M_p);
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)atof(pbVar10[5]._M_dataplus._M_p);
    atof(pbVar10[6]._M_dataplus._M_p);
    local_358 = 0;
    psVar5 = (local_448->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar3 = psVar5 + (long)iVar14 + -1;
    uVar1 = psVar3->mass;
    uVar2 = psVar3->n_mass;
    local_350._8_4_ = (int)uVar1;
    local_350._0_8_ = uVar2;
    local_350._12_4_ = (int)((ulong)uVar1 >> 0x20);
    local_340 = psVar5[(long)iVar14 + -1].r_node;
    local_338 = local_340;
    std::__cxx11::list<sNode,_std::allocator<sNode>_>::push_back(this_00,(sNode *)&chains);
    sNode::~sNode((sNode *)&chains);
    lVar17 = lVar17 + 0x20;
  }
  poVar18 = std::operator<<((ostream *)&std::cout,"#: --- ");
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_474);
  std::operator<<(poVar18," nodes have been added to the network structure.\n");
  local_460 = (ulong)(local_44c + 2);
  dVar19 = 0.0;
  dVar20 = (double)(ulong)uVar11;
  if ((int)uVar11 < 1) {
    dVar20 = dVar19;
  }
  iVar14 = 0;
  while (dVar19 != dVar20) {
    lVar17 = (long)dVar19 + local_460;
    local_470 = dVar19;
    std::__cxx11::string::string
              ((string *)&local_2d8,
               (string *)
               (lines_of_file.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar17));
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&chains,&local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&tokens,(value_type *)&chains);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&chains);
    std::__cxx11::string::~string((string *)&local_2d8);
    pbVar10 = tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_3a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar15 = atoi(((tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(chains.
                           super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar15);
    iVar15 = atoi(pbVar10[1]._M_dataplus._M_p);
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(iVar15,chains.
                                  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
    iVar15 = atoi(pbVar10[5]._M_dataplus._M_p);
    if (iVar14 < iVar15) {
      iVar14 = iVar15;
    }
    chains.
    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_5_ = CONCAT14(iVar15 == 0,iVar15);
    iVar15 = atoi(pbVar10[2]._M_dataplus._M_p);
    iVar16 = atoi(pbVar10[3]._M_dataplus._M_p);
    if (((int)local_474 < iVar15) || ((int)local_474 < iVar16)) {
      poVar18 = std::operator<<((ostream *)&std::cout,": --- There is a problem at line: ");
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)lVar17 + 1);
      poVar18 = std::operator<<(poVar18," of the data file.\n");
      poVar18 = std::operator<<(poVar18,(string *)
                                        (lines_of_file.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar17));
      std::operator<<(poVar18,"\n");
      exit(0);
    }
    uVar11 = 0;
    p_Var21 = (_List_node_base *)this_00;
    while ((p_Var21 = (((_List_base<sNode,_std::allocator<sNode>_> *)&p_Var21->_M_next)->_M_impl).
                      _M_node.super__List_node_base._M_next, p_Var21 != (_List_node_base *)this_00
           && (uVar11 < 2))) {
      if ((*(int *)&p_Var21[1]._M_next == iVar15) || (*(int *)&p_Var21[1]._M_next == iVar16)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)(p_Var21 + 3),
                   (value_type_conflict1 *)
                   &chains.
                    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        dyr = (double)(p_Var21 + 1);
        std::vector<sNode*,std::allocator<sNode*>>::emplace_back<sNode*>
                  ((vector<sNode*,std::allocator<sNode*>> *)&local_3a8,(sNode **)&dyr);
        uVar11 = uVar11 + 1;
      }
    }
    if (chains.
        super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_1_ == '\x01') {
      chains.
      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)chains.
                            super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000)
      ;
    }
    std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::push_back
              ((list<sStrand,_std::allocator<sStrand>_> *)local_468,(value_type *)&chains);
    if (chains.
        super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_1_ == '\x01') {
      dyr = (double)((local_328->strands).super__List_base<sStrand,_std::allocator<sStrand>_>.
                     _M_impl._M_node.super__List_node_base._M_prev + 1);
      std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                (this_01,(value_type *)&dyr);
    }
    std::_Vector_base<sNode_*,_std::allocator<sNode_*>_>::~_Vector_base(&local_3a8);
    dVar19 = (double)((long)local_470 + 1);
  }
  p_Var21 = local_468;
  while (p_Var21 = p_Var21->_M_next, p_Var21 != local_468) {
    if (*(undefined1 *)((long)&p_Var21[1]._M_prev + 4) == '\0') {
      chains.
      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var21 + 1);
      std::vector<sStrand*,std::allocator<sStrand*>>::emplace_back<sStrand*>
                ((vector<sStrand*,std::allocator<sStrand*>> *)(*(long *)p_Var21[4]._M_next + 0x38),
                 (sStrand **)&chains);
      chains.
      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var21 + 1);
      std::vector<sStrand*,std::allocator<sStrand*>>::emplace_back<sStrand*>
                ((vector<sStrand*,std::allocator<sStrand*>> *)
                 (*(long *)((long)p_Var21[4]._M_next + 8) + 0x38),(sStrand **)&chains);
    }
  }
  local_460 = CONCAT44(local_460._4_4_,iVar14);
  p_Var21 = local_468;
  while (p_Var21 = p_Var21->_M_next, p_Var21 != local_468) {
    if (*(undefined1 *)((long)&p_Var21[1]._M_prev + 4) == '\0') {
      lVar17 = *(long *)p_Var21[4]._M_next;
      lVar6 = *(long *)((long)p_Var21[4]._M_next + 8);
      chains.
      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(*(double *)(lVar6 + 8) - *(double *)(lVar17 + 8));
      dyr = *(double *)(lVar6 + 0x10) - *(double *)(lVar17 + 0x10);
      dzr = *(double *)(lVar6 + 0x18) - *(double *)(lVar17 + 0x18);
      Domain::minimum_image(local_330->domain,(double *)&chains,&dyr,&dzr);
      local_470 = SQRT(dzr * dzr +
                       (double)chains.
                               super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start *
                       (double)chains.
                               super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + dyr * dyr);
      if (0.0001 < local_470 - (double)p_Var21[3]._M_next / (double)p_Var21[3]._M_prev) {
        poVar18 = std::operator<<((ostream *)&std::cout,"Strand ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,*(int *)&p_Var21[1]._M_next);
        std::operator<<(poVar18," has length ");
        poVar18 = std::ostream::_M_insert<double>
                            ((double)p_Var21[3]._M_next / (double)p_Var21[3]._M_prev);
        std::operator<<(poVar18," but real dist ");
        poVar18 = std::ostream::_M_insert<double>(local_470);
        std::endl<char,std::char_traits<char>>(poVar18);
      }
    }
  }
  uVar23 = local_460 & 0xffffffff;
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::vector(&chains,uVar23,(allocator_type *)&dyr);
  p_Var21 = local_468;
  while (p_Var21 = (((_List_base<sStrand,_std::allocator<sStrand>_> *)&p_Var21->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next, p_Var21 != local_468) {
    if (*(undefined1 *)((long)&p_Var21[1]._M_prev + 4) == '\0') {
      dyr = (double)(p_Var21 + 1);
      std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                (chains.
                 super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)*(int *)&p_Var21[1]._M_prev + -1,
                 (value_type *)&dyr);
    }
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::resize(local_440,uVar23);
  uVar11 = 0;
  do {
    uVar23 = (ulong)uVar11;
    if ((ulong)(((long)chains.
                       super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)chains.
                      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar23) {
LAB_00108883:
      std::
      vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ::~vector(&chains);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines_of_file);
      std::ifstream::~ifstream(&data_file);
      return;
    }
    __position = std::
                 __find_if<std::_List_iterator<sStrand*>,__gnu_cxx::__ops::_Iter_pred<bool(*)(sStrand*)>>
                           (chains.
                            super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar23].
                            super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
                            super__List_node_base._M_next,
                            chains.
                            super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar23,pred_strand_is_end);
    if (__position._M_node ==
        (_List_node_base *)
        (chains.
         super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + uVar23)) {
      poVar18 = std::operator<<((ostream *)&std::cout,"Chain with no ends was found: ");
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      std::operator<<(poVar18," .\n");
      poVar18 = std::operator<<((ostream *)&std::cout,"Number of strands: ");
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      std::operator<<(poVar18," .\n");
      goto LAB_00108883;
    }
    p_Var21 = __position._M_node[1]._M_next[3]._M_next;
    p_Var7 = p_Var21->_M_next;
    if (*(int *)((long)&p_Var7->_M_next + 4) != 1) {
      p_Var21->_M_next = p_Var21->_M_prev;
      (__position._M_node[1]._M_next[3]._M_next)->_M_prev = p_Var7;
    }
    std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
              ((local_440->
               super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar23,
               (value_type *)(__position._M_node + 1));
    if (1 < chains.
            super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar23].
            super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node._M_size) {
      std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::erase
                (chains.
                 super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23,
                 (const_iterator)__position._M_node);
      iVar14 = (int)chains.
                    super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar23].
                    super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node._M_size;
      iVar15 = 0;
      if (iVar14 < 1) {
        iVar14 = iVar15;
      }
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        plVar8 = (local_440->
                 super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        __position_00._M_node =
             (_List_node_base *)
             (chains.
              super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar23);
        do {
          __position_00._M_node = (__position_00._M_node)->_M_next;
          if (__position_00._M_node ==
              (_List_node_base *)
              (chains.
               super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar23)) goto LAB_00108810;
          p_Var21 = __position_00._M_node[1]._M_next[3]._M_next;
          p_Var7 = p_Var21->_M_next;
          p_Var9 = ((*(_List_node_base **)
                      ((long)&plVar8[uVar23].super__List_base<sStrand_*,_std::allocator<sStrand_*>_>
                              ._M_impl._M_node + 8))[1]._M_next[3]._M_next)->_M_prev;
          if (p_Var7 == p_Var9) {
            std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                      (plVar8 + uVar23,(value_type *)(__position_00._M_node + 1));
            goto LAB_001087fd;
          }
        } while (p_Var21->_M_prev != p_Var9);
        p_Var21->_M_next = p_Var21->_M_prev;
        (__position_00._M_node[1]._M_next[3]._M_next)->_M_prev = p_Var7;
        std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                  ((local_440->
                   super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar23,
                   (value_type *)(__position_00._M_node + 1));
LAB_001087fd:
        std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::erase
                  (chains.
                   super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar23,__position_00);
LAB_00108810:
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

Network::Network(class NetwMin *netw_min, std::string filename) {

      int nnodes = 0, nstrands = 0, atoms_line_start = 0, bonds_line_start = 0,
              bond_coeffs_line_start = 0, masses_line_start = 0, pair_coeffs_line_start = 0,
              atom_types_line = 0, bond_types_line = 0, ihelp;

      nstrands = 0;
      cout << "#: Initializing network.\n";
      /* Define and open the desired file. */
      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;
      std::vector <string> tokens;

      /* Read and search file. */
      int iline = 0;

      while (data_file.good()) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);

         if (current_line.find("atoms") != string::npos)
            nnodes = atoi(current_line.c_str());
         if (current_line.find("bonds") != string::npos)
            nstrands = atoi(current_line.c_str());
         if (current_line.find("Atoms") != string::npos)
            atoms_line_start = iline;
         if (current_line.find("Bonds") != string::npos)
            bonds_line_start = iline;
         if (current_line.find("Masses") != string::npos)
            masses_line_start = iline;
         if ((current_line.find("Bond") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            bond_coeffs_line_start = iline;
         if ((current_line.find("Pair") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            pair_coeffs_line_start = iline;
         if ((current_line.find("atom") != string::npos)
                 && (current_line.find("types") != string::npos))
            atom_types_line = iline;
         if ((current_line.find("bond") != string::npos)
                 && (current_line.find("types") != string::npos))
            bond_types_line = iline;

         iline++;
      }
      data_file.close();

      /* Read the masses of the nodes from the corresponding session of the data file. */
      tokens = tokenize(lines_of_file[atom_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bead types: " << ihelp << " .\n";
      node_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++) {
         tokens = tokenize(lines_of_file[masses_line_start + i + 2]);
         node_types[i].n_mass = atof(tokens[1].c_str());
         node_types[i].mass = atof(tokens[2].c_str());

         tokens = tokenize(lines_of_file[pair_coeffs_line_start+i+2]);
         node_types[i].r_node = atof(tokens[1].c_str());
      }

      /* Read the bond coefficients from the corresponding section of the data file. */
      tokens = tokenize(lines_of_file[bond_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bond types: " << ihelp << " .\n";
      bond_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++){
         tokens = tokenize(lines_of_file[bond_coeffs_line_start + i + 2]);
         bond_types[i].spring_coeff = atof(tokens[1].c_str());
         bond_types[i].sq_ete = atof(tokens[2].c_str());
         bond_types[i].kuhnl = atof(tokens[3].c_str());
      }

      /* Read atom sections which corresponds to nodal points: */
      for (int i = 0; i < nnodes; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[atoms_line_start + 2 + i]);

         
         //int pbcx = atoi(tokens[7].c_str());
         //int pbcy = atoi(tokens[8].c_str());
         //int pbcz = atoi(tokens[9].c_str());
         
         /* Set the attributes of the current node object. */
         tNode current_node;
         current_node.Id = atoi(tokens[0].c_str());
         current_node.Type = atoi(tokens[2].c_str());
         current_node.Pos[0] = atof(tokens[4].c_str()); //+ (double)pbcx*netw_min->domain->XBoxLen;
         current_node.Pos[1] = atof(tokens[5].c_str()); //+ (double)pbcy*netw_min->domain->YBoxLen;
         current_node.Pos[2] = atof(tokens[6].c_str()); //+ (double)pbcz*netw_min->domain->ZBoxLen;
         current_node.node_cell = 0;

         // Read the mass of the nodal point from the "Masses" section of the file.
         current_node.n_mass = node_types[current_node.Type-1].n_mass;
         current_node.mass = node_types[current_node.Type-1].mass;

         /* Pair coeffs come from the data file in Angstrom. */
         current_node.r_node = node_types[current_node.Type-1].r_node;
         current_node.r_star = current_node.r_node;

         nodes.push_back(current_node);
      }
      cout << "#: --- " << nnodes << " nodes have been added to the network structure.\n";


      int nchains = 0;

      for (int i = 0; i < nstrands; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[bonds_line_start + 2 + i]);
         
         /* Create a temporary object: */
         tStrand current_strand;
         current_strand.Id = atoi(tokens[0].c_str());
         current_strand.Type = atoi(tokens[1].c_str());
         current_strand.OrChain = atoi(tokens[5].c_str());
         if (current_strand.OrChain > nchains)
            nchains = current_strand.OrChain;

         if (current_strand.OrChain == 0)
            current_strand.slip_spring = true;
         else
            current_strand.slip_spring = false;

         /* Read the tags of the start and the end of the strand. */
         int snode = atoi(tokens[2].c_str());
         int enode = atoi(tokens[3].c_str());

         if (snode > (nnodes) || enode > (nnodes)){
            cout << ": --- There is a problem at line: " << (bonds_line_start + 2 + i + 1) 
                 << " of the data file.\n" << lines_of_file[bonds_line_start + 2 + i] << "\n";
            exit(0);
         }
         
         /* We have to find the nodal point whose tag is equal to snode: */
         int found = 0;
         for (std::list <tNode>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
            if (found > 1)
               break;
            if ((*it).Id == snode || (*it).Id == enode) {
               found++;
               (*it).OrChains.push_back(current_strand.OrChain);
               current_strand.pEnds.push_back(&(*it));
            }
         }

         /* Spring coeffs comes from the data file in kJ/mol/K/A^2 */
         current_strand.spring_coeff = bond_types[current_strand.Type-1].spring_coeff;
         /* Length of the strand (n*b) comes from the data file in Angstroms. */
         current_strand.sq_end_to_end = bond_types[current_strand.Type-1].sq_ete;
         current_strand.kuhn_length = bond_types[current_strand.Type-1].kuhnl;

         /* Set the creation time of the slip-spring: */
         if (current_strand.slip_spring)
            current_strand.tcreation = 0;
         
         /* and push it back to the list: */
         strands.push_back(current_strand);

         /* 2013/04/09: Also, push back a pointer to the last element of "strands" vector, if 
          *             the inserted strand is a slip spring. */
         if (current_strand.slip_spring)
            pslip_springs.push_back(&(strands.back()));
      }



      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         /* 2013/04/09: We exclude slip strings from the local registry of strands connected to 
          *             a specific node. Array "pStrands" contains only chain strands, 
          *             not slip-springs!!. */
         if (!(*it).slip_spring) {
            (*it).pEnds[0]->pStrands.push_back(&(*it));
            (*it).pEnds[1]->pStrands.push_back(&(*it));
         }
      }

      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         if ((*it).slip_spring)
            continue;

         double dxr = (*it).pEnds[1]->Pos[0] - (*it).pEnds[0]->Pos[0];
         double dyr = (*it).pEnds[1]->Pos[1] - (*it).pEnds[0]->Pos[1];
         double dzr = (*it).pEnds[1]->Pos[2] - (*it).pEnds[0]->Pos[2];
         netw_min->domain->minimum_image(dxr, dyr, dzr);

         double dist = sqrt(dxr * dxr + dyr * dyr + dzr * dzr);
         if (dist - (*it).sq_end_to_end / (*it).kuhn_length > tol)
            cout << "Strand " << (*it).Id << " has length " << (*it).sq_end_to_end 
                  / (*it).kuhn_length << " but real dist " << dist << endl;

      }

      /* Categorize strands into chains: */
      std::vector<std::list<tStrand *> > chains(nchains);
      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it)
         if (!(*it).slip_spring)
            chains[(*it).OrChain - 1].push_back(&(*it));


      /* Loop over all chains: */
      sorted_chains.resize(nchains);

      for (unsigned int ich = 0; ich < chains.size(); ich++) {
         /* Search to find an end of the chain: */
         std::list <tStrand *>::iterator it, jt;
         jt = find_if(chains[ich].begin(), chains[ich].end(), pred_strand_is_end);
         if (jt == chains[ich].end()) {
            cout << "Chain with no ends was found: " << ich << " .\n";
            cout << "Number of strands: " << chains[ich].size() << " .\n";
            return;
         }

         if ((*jt)->pEnds[0]->Type != 1) {
            tNode *temp;
            temp = (*jt)->pEnds[0];
            (*jt)->pEnds[0] = (*jt)->pEnds[1];
            (*jt)->pEnds[1] = temp;
         }
         sorted_chains[ich].push_back((*jt));
         if (chains[ich].size() > 1)
            chains[ich].erase(jt);
         else
            continue;

         int nelems = chains[ich].size();
         for (int i = 0; i < nelems; i++) {
            /* Set the iterator to the end of the sorted list: */
            it = sorted_chains[ich].end();
            --it;

            /* Find the next element: */
            for (jt = chains[ich].begin(); jt != chains[ich].end(); ++jt) {
               /* check whether is connected to the preceeding strand: */
               if ((*jt)->pEnds[0] == (*it)->pEnds[1]) {
                  /* We can append the found strand as is: */
                  sorted_chains[ich].push_back((*jt));
                  /* an delete it from the previous list */
                  jt = chains[ich].erase(jt);
                  break;
               }

               if ((*jt)->pEnds[1] == (*it)->pEnds[1]) {
                  /* We have to change the order of the pointers. */
                  tNode *temp;
                  temp = (*jt)->pEnds[0];
                  (*jt)->pEnds[0] = (*jt)->pEnds[1];
                  (*jt)->pEnds[1] = temp;

                  /* And add it to the list: */
                  sorted_chains[ich].push_back((*jt));
                  jt = chains[ich].erase(jt);
                  break;
               }
            }
         }
      }


      return;
   }